

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_attribute<char> * __thiscall
rapidxml::memory_pool<char>::allocate_attribute
          (memory_pool<char> *this,char *name,char *value,size_t name_size,size_t value_size)

{
  xml_attribute<char> *this_00;
  
  this_00 = (xml_attribute<char> *)allocate_aligned(this,0x38);
  (this_00->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (this_00->super_xml_base<char>).m_name = (char *)0x0;
  (this_00->super_xml_base<char>).m_value = (char *)0x0;
  if (name != (char *)0x0) {
    if (name_size == 0) {
      xml_base<char>::name((xml_base<char> *)this_00,name);
    }
    else {
      (this_00->super_xml_base<char>).m_name = name;
      (this_00->super_xml_base<char>).m_name_size = name_size;
    }
  }
  if (value != (char *)0x0) {
    if (value_size == 0) {
      xml_base<char>::value((xml_base<char> *)this_00,value);
    }
    else {
      (this_00->super_xml_base<char>).m_value = value;
      (this_00->super_xml_base<char>).m_value_size = value_size;
    }
  }
  return this_00;
}

Assistant:

xml_attribute<Ch> *allocate_attribute(const Ch *name = 0, const Ch *value = 0, 
                                              std::size_t name_size = 0, std::size_t value_size = 0)
        {
            void *memory = allocate_aligned(sizeof(xml_attribute<Ch>));
            xml_attribute<Ch> *attribute = new(memory) xml_attribute<Ch>;
            if (name)
            {
                if (name_size > 0)
                    attribute->name(name, name_size);
                else
                    attribute->name(name);
            }
            if (value)
            {
                if (value_size > 0)
                    attribute->value(value, value_size);
                else
                    attribute->value(value);
            }
            return attribute;
        }